

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollState::NextIterationState(LoopUnrollState *this)

{
  LoopUnrollState *this_local;
  
  this->previous_phi_ = this->new_phi;
  this->previous_latch_block_ = this->new_latch_block;
  this->previous_condition_block_ = this->new_condition_block;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  operator=(&this->previous_phis_,&this->new_phis_);
  this->new_phi = (Instruction *)0x0;
  this->new_continue_block = (BasicBlock *)0x0;
  this->new_condition_block = (BasicBlock *)0x0;
  this->new_header_block = (BasicBlock *)0x0;
  this->new_latch_block = (BasicBlock *)0x0;
  std::
  unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
  ::clear(&this->new_blocks);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::clear(&this->new_inst);
  std::
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  ::clear(&this->ids_to_new_inst);
  return;
}

Assistant:

void NextIterationState() {
    previous_phi_ = new_phi;
    previous_latch_block_ = new_latch_block;
    previous_condition_block_ = new_condition_block;
    previous_phis_ = std::move(new_phis_);

    // Clear new nodes.
    new_phi = nullptr;
    new_continue_block = nullptr;
    new_condition_block = nullptr;
    new_header_block = nullptr;
    new_latch_block = nullptr;

    // Clear new block/instruction maps.
    new_blocks.clear();
    new_inst.clear();
    ids_to_new_inst.clear();
  }